

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::anon_unknown_10::LogFileObject::~LogFileObject(LogFileObject *this)

{
  MutexLock local_18;
  MutexLock l;
  LogFileObject *this_local;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__LogFileObject_0015caf8;
  l.mu_ = (Mutex *)this;
  ::glog_internal_namespace_::MutexLock::MutexLock(&local_18,&this->lock_);
  if (this->file_ != (FILE *)0x0) {
    fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_18);
  std::__cxx11::string::~string((string *)&this->filename_extension_);
  std::__cxx11::string::~string((string *)&this->symlink_basename_);
  std::__cxx11::string::~string((string *)&this->base_filename_);
  ::glog_internal_namespace_::Mutex::~Mutex(&this->lock_);
  google::base::Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

LogFileObject::~LogFileObject() {
  MutexLock l(&lock_);
  if (file_ != NULL) {
    fclose(file_);
    file_ = NULL;
  }
}